

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexReinit(Fts5Index *p)

{
  long lVar1;
  int iVar2;
  Fts5Index *in_RDI;
  long in_FS_OFFSET;
  Fts5Structure s;
  undefined1 local_38 [4];
  int in_stack_ffffffffffffffcc;
  Fts5Structure *in_stack_ffffffffffffffd0;
  Fts5Index *in_stack_ffffffffffffffd8;
  Fts5Index *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x30);
  fts5StructureInvalidate((Fts5Index *)0x268fa5);
  fts5IndexDiscardData((Fts5Index *)0x268faf);
  memset(local_38,0,0x30);
  if (in_RDI->pConfig->bContentlessDelete != 0) {
    in_stack_ffffffffffffffd8 = (Fts5Index *)&DAT_00000001;
  }
  fts5DataWrite(in_stack_ffffffffffffffe0,(i64)in_stack_ffffffffffffffd8,
                (u8 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  fts5StructureWrite(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  iVar2 = fts5IndexReturn(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexReinit(Fts5Index *p){
  Fts5Structure s;
  fts5StructureInvalidate(p);
  fts5IndexDiscardData(p);
  memset(&s, 0, sizeof(Fts5Structure));
  if( p->pConfig->bContentlessDelete ){
    s.nOriginCntr = 1;
  }
  fts5DataWrite(p, FTS5_AVERAGES_ROWID, (const u8*)"", 0);
  fts5StructureWrite(p, &s);
  return fts5IndexReturn(p);
}